

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O1

void __thiscall SynthStateMonitor::allocatePartialsData(SynthStateMonitor *this)

{
  uint uVar1;
  QGridLayout *pQVar2;
  ulong uVar3;
  PartialState *pPVar4;
  Bit8u *pBVar5;
  PartialStateLEDWidget **ppPVar6;
  PartialStateLEDWidget *this_00;
  QWidget *parent;
  ulong uVar7;
  
  uVar1 = this->partialCount;
  uVar7 = (ulong)uVar1;
  pPVar4 = (PartialState *)operator_new__(uVar7 * 4);
  this->partialStates = pPVar4;
  pBVar5 = (Bit8u *)operator_new__(uVar7);
  this->keysOfPlayingNotes = pBVar5;
  pBVar5 = (Bit8u *)operator_new__(uVar7);
  this->velocitiesOfPlayingNotes = pBVar5;
  ppPVar6 = (PartialStateLEDWidget **)operator_new__(uVar7 * 8);
  this->partialStateLED = ppPVar6;
  if (this->partialCount != 0) {
    uVar7 = 0;
    do {
      this_00 = (PartialStateLEDWidget *)operator_new(0x30);
      pQVar2 = (this->ui->super_Ui_SynthWidget).partialStateGrid;
      parent = (QWidget *)(**(code **)(*(long *)(pQVar2 + 0x10) + 0x68))(pQVar2 + 0x10);
      PartialStateLEDWidget::PartialStateLEDWidget(this_00,parent);
      this->partialStateLED[uVar7] = this_00;
      QWidget::setFixedSize((int)this->partialStateLED[uVar7],0x10);
      uVar3 = (ulong)(uVar1 + 7 >> 3);
      QGridLayout::addWidget
                ((this->ui->super_Ui_SynthWidget).partialStateGrid,this->partialStateLED[uVar7],
                 (uVar7 & 0xffffffff) / uVar3,(uVar7 & 0xffffffff) % uVar3,0);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->partialCount);
  }
  return;
}

Assistant:

void SynthStateMonitor::allocatePartialsData() {
	partialStates = new PartialState[partialCount];
	keysOfPlayingNotes = new Bit8u[partialCount];
	velocitiesOfPlayingNotes = new Bit8u[partialCount];

	partialStateLED = new PartialStateLEDWidget*[partialCount];
	uint partialColumnWidth = (partialCount + 7) / 8;
	for (uint i = 0; i < partialCount; i++) {
		partialStateLED[i] = new PartialStateLEDWidget(ui->partialStateGrid->widget());
		partialStateLED[i]->setFixedSize(16, 16);
		ui->partialStateGrid->addWidget(partialStateLED[i], i / partialColumnWidth, i % partialColumnWidth);
	}
}